

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O1

Gia_Man_t * Acec_InsertBox(Acec_Box_t *pBox,int fAll)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  undefined8 uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Vec_Int_t *pVVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  
  p = pBox->pGia;
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar18 = 0;
    do {
      iVar1 = pVVar12->pArray[lVar18];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00677a17;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_00677a93;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_00677a93;
      pGVar4[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar12 = p->vCis;
    } while (lVar18 < pVVar12->nSize);
  }
  if (fAll == 0) {
    if (pBox->vShared == (Vec_Wec_t *)0x0) {
      __assert_fail("pBox->vShared != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0xaf,"Gia_Man_t *Acec_InsertBox(Acec_Box_t *, int)");
    }
    if (pBox->vUnique == (Vec_Wec_t *)0x0) {
      __assert_fail("pBox->vUnique != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0xb0,"Gia_Man_t *Acec_InsertBox(Acec_Box_t *, int)");
    }
    pVVar13 = Acec_BuildTree(p_00,p,pBox->vShared,(Vec_Int_t *)0x0);
    pVVar12 = Acec_BuildTree(p_00,p,pBox->vUnique,pVVar13);
    if (pVVar13->pArray != (int *)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (int *)0x0;
    }
    if (pVVar13 != (Vec_Int_t *)0x0) {
      free(pVVar13);
    }
  }
  else {
    pVVar12 = Acec_BuildTree(p_00,p,pBox->vLeafLits,(Vec_Int_t *)0x0);
  }
  lVar18 = (long)pBox->vRootLits->nSize;
  if (0 < lVar18) {
    pVVar13 = pBox->vRootLits->pArray;
    lVar15 = 0;
    do {
      lVar16 = (long)pVVar13[lVar15].nSize;
      if (0 < lVar16) {
        piVar7 = pVVar13[lVar15].pArray;
        lVar17 = 0;
        do {
          uVar2 = piVar7[lVar17];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (p->nObjs <= (int)(uVar2 >> 1)) goto LAB_00677a17;
          uVar20 = 0;
          if (lVar17 == 0) {
            if (pVVar12->nSize <= lVar15) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar20 = pVVar12->pArray[lVar15];
          }
          if ((int)uVar20 < 0) goto LAB_00677a36;
          p->pObjs[uVar2 >> 1].Value = uVar20 ^ uVar2 & 1;
          lVar17 = lVar17 + 1;
        } while (lVar16 != lVar17);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar18);
  }
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
    pVVar12->pArray = (int *)0x0;
  }
  if (pVVar12 != (Vec_Int_t *)0x0) {
    free(pVVar12);
  }
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar18 = 0;
    do {
      iVar1 = pVVar12->pArray[lVar18];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00677a17;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar1;
      Acec_InsertBox_rec(p_00,p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
      lVar18 = lVar18 + 1;
      pVVar12 = p->vCos;
    } while (lVar18 < pVVar12->nSize);
  }
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar18 = 0;
    do {
      iVar1 = pVVar12->pArray[lVar18];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00677a17:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar1;
      uVar8 = *(undefined8 *)pGVar4;
      uVar2 = pGVar4[-(ulong)((uint)uVar8 & 0x1fffffff)].Value;
      if ((int)uVar2 < 0) {
LAB_00677a36:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar20 = uVar2 >> 1;
      if (p_00->nObjs <= (int)uVar20) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(p_00->pObjs + uVar20) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar20) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x80000000;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_00677a93:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar14 = (ulong)(((uint)((int)pGVar11 - (int)pGVar6) >> 2) * -0x55555555 - uVar20 & 0x1fffffff
                      );
      uVar19 = (ulong)((uVar2 << 0x1d ^ (uint)uVar8) & 0x20000000);
      *(ulong *)pGVar11 = uVar19 | uVar5 & 0xffffffffc0000000 | 0x80000000 | uVar14;
      *(ulong *)pGVar11 =
           uVar19 | uVar5 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_00677a93;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11)
        ;
      }
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_00677a93;
      pGVar4->Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar12 = p->vCos;
    } while (lVar18 < pVVar12->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Acec_InsertBox( Acec_Box_t * pBox, int fAll )
{
    Gia_Man_t * p = pBox->pGia;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vRootRanks, * vLevel, * vTemp;
    int i, k, iLit, iLitNew;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // implement tree
    if ( fAll )
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vLeafLits, NULL );
    else
    {
        assert( pBox->vShared != NULL );
        assert( pBox->vUnique != NULL );
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vShared, NULL );
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vUnique, vTemp = vRootRanks );
        Vec_IntFree( vTemp );
    }
    // update polarity of literals
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
            iLitNew = k ? 0 : Vec_IntEntry( vRootRanks, i );
            pObj->Value = Abc_LitNotCond( iLitNew, Abc_LitIsCompl(iLit) );
        }
    Vec_IntFree( vRootRanks );
    // construct the outputs
    Gia_ManForEachCo( p, pObj, i )
        Acec_InsertBox_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}